

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O3

Offset<void> __thiscall
CharacterUnion::Pack(CharacterUnion *this,FlatBufferBuilder *_fbb,rehasher_function_t *_rehasher)

{
  int e;
  Offset<const_BookReader_*> OVar1;
  uoffset_t uVar2;
  Offset<const_Rapunzel_*> OVar3;
  offset_type oVar4;
  
  switch(this->type) {
  case Character_MuLan:
    e = *this->value;
    flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
    _fbb->nested = true;
    uVar2 = (_fbb->buf_).size_;
    flatbuffers::FlatBufferBuilderImpl<false>::AddElement<int>(_fbb,4,e,0);
    uVar2 = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,uVar2);
    return (Offset<void>)uVar2;
  case Character_Rapunzel:
    OVar3 = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<Rapunzel>
                      (_fbb,(Rapunzel *)this->value);
    return (Offset<void>)OVar3.o;
  case Character_Belle:
  case Character_BookFan:
    OVar1 = flatbuffers::FlatBufferBuilderImpl<false>::CreateStruct<BookReader>
                      (_fbb,(BookReader *)this->value);
    return (Offset<void>)OVar1.o;
  case Character_Other:
  case Character_MAX:
    flatbuffers::FlatBufferBuilderImpl<false>::CreateStringImpl
              (_fbb,*this->value,*(size_t *)((long)this->value + 8));
    oVar4 = (_fbb->buf_).size_;
    break;
  default:
    oVar4 = 0;
  }
  return (Offset<void>)oVar4;
}

Assistant:

inline ::flatbuffers::Offset<void> CharacterUnion::Pack(::flatbuffers::FlatBufferBuilder &_fbb, const ::flatbuffers::rehasher_function_t *_rehasher) const {
  (void)_rehasher;
  switch (type) {
    case Character_MuLan: {
      auto ptr = reinterpret_cast<const AttackerT *>(value);
      return CreateAttacker(_fbb, ptr, _rehasher).Union();
    }
    case Character_Rapunzel: {
      auto ptr = reinterpret_cast<const Rapunzel *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Belle: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_BookFan: {
      auto ptr = reinterpret_cast<const BookReader *>(value);
      return _fbb.CreateStruct(*ptr).Union();
    }
    case Character_Other: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    case Character_Unused: {
      auto ptr = reinterpret_cast<const std::string *>(value);
      return _fbb.CreateString(*ptr).Union();
    }
    default: return 0;
  }
}